

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFArrayBox.cpp
# Opt level: O1

Array<const_FArrayBox_*,_3> * __thiscall
amrex::EBFArrayBox::getEdgeCentData
          (Array<const_FArrayBox_*,_3> *__return_storage_ptr__,EBFArrayBox *this)

{
  bool bVar1;
  FArrayBox *pFVar2;
  MultiCutFab *local_28;
  MultiCutFab *local_20;
  MultiCutFab *local_18;
  
  if ((this->m_factory != (EBFArrayBoxFactory *)0x0) && (-1 < this->m_box_index)) {
    EBDataCollection::getEdgeCent
              ((this->m_factory->m_ebdc).
               super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    bVar1 = MultiCutFab::ok(local_28,this->m_box_index);
    if (bVar1) {
      pFVar2 = &MultiCutFab::operator[](local_28,this->m_box_index)->super_FArrayBox;
      __return_storage_ptr__->_M_elems[0] = pFVar2;
      pFVar2 = &MultiCutFab::operator[](local_20,this->m_box_index)->super_FArrayBox;
      __return_storage_ptr__->_M_elems[1] = pFVar2;
      pFVar2 = &MultiCutFab::operator[](local_18,this->m_box_index)->super_FArrayBox;
      __return_storage_ptr__->_M_elems[2] = pFVar2;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->_M_elems[0] = (FArrayBox *)0x0;
  __return_storage_ptr__->_M_elems[1] = (FArrayBox *)0x0;
  __return_storage_ptr__->_M_elems[2] = (FArrayBox *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Array<const FArrayBox*, AMREX_SPACEDIM>
EBFArrayBox::getEdgeCentData () const
{
    if (m_factory && m_box_index >= 0) {
        Array<MultiCutFab const*, AMREX_SPACEDIM> const& mfs = m_factory->getEdgeCent();
        if (mfs[0]->ok(m_box_index)) {
            return {AMREX_D_DECL(&((*mfs[0])[m_box_index]),
                                 &((*mfs[1])[m_box_index]),
                                 &((*mfs[2])[m_box_index]))};
        } else {
            return {AMREX_D_DECL(nullptr,nullptr,nullptr)};
        }
    } else {
        return {AMREX_D_DECL(nullptr,nullptr,nullptr)};
    }
}